

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

real __thiscall fasttext::Vector::norm(Vector *this)

{
  value_type vVar1;
  undefined1 auVar2 [16];
  int64_t iVar3;
  const_reference pvVar4;
  vector<float,_std::allocator<float>_> *in_RDI;
  double dVar5;
  int64_t i;
  real sum;
  undefined8 local_18;
  undefined4 local_c;
  
  local_c = 0;
  local_18 = 0;
  while( true ) {
    iVar3 = size((Vector *)0x19422a);
    if (iVar3 <= (long)local_18) break;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](in_RDI,local_18);
    vVar1 = *pvVar4;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](in_RDI,local_18);
    auVar2 = vfmadd213ss_fma(ZEXT416((uint)*pvVar4),ZEXT416((uint)vVar1),ZEXT416(local_c));
    local_c = auVar2._0_4_;
    local_18 = local_18 + 1;
  }
  dVar5 = std::sqrt((double)(ulong)local_c);
  return SUB84(dVar5,0);
}

Assistant:

real Vector::norm() const {
  real sum = 0;
  for (int64_t i = 0; i < size(); i++) {
    sum += data_[i] * data_[i];
  }
  return std::sqrt(sum);
}